

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O0

stbi_uc * psd_load(stbi *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  uint32 uVar2;
  int iVar3;
  uint32 x_00;
  int iVar4;
  uint32 uVar5;
  int iVar6;
  uint uVar7;
  uchar *local_78;
  uint8 *p_1;
  uchar *puStack_68;
  uint32 val;
  uint8 *p;
  uint8 *out;
  int h;
  int w;
  int len;
  int count;
  int i;
  int channel;
  int compression;
  int channelCount;
  int pixelCount;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  stbi *s_local;
  
  uVar2 = get32(s);
  if (uVar2 == 0x38425053) {
    iVar3 = get16(s);
    if (iVar3 == 1) {
      skip(s,6);
      iVar3 = get16(s);
      if ((iVar3 < 0) || (0x10 < iVar3)) {
        e("Unsupported number of channels in PSD image");
        s_local = (stbi *)0x0;
      }
      else {
        uVar2 = get32(s);
        x_00 = get32(s);
        iVar4 = get16(s);
        if (iVar4 == 8) {
          iVar4 = get16(s);
          if (iVar4 == 3) {
            uVar5 = get32(s);
            skip(s,uVar5);
            uVar5 = get32(s);
            skip(s,uVar5);
            uVar5 = get32(s);
            skip(s,uVar5);
            iVar4 = get16(s);
            if (iVar4 < 2) {
              p = (uint8 *)malloc((long)(int)(x_00 * 4 * uVar2));
              if (p == (uchar *)0x0) {
                e("Out of memory");
                s_local = (stbi *)0x0;
              }
              else {
                iVar6 = x_00 * uVar2;
                if (iVar4 == 0) {
                  for (count = 0; count < 4; count = count + 1) {
                    local_78 = p + count;
                    if (iVar3 < count) {
                      for (len = 0; len < iVar6; len = len + 1) {
                        uVar1 = '\0';
                        if (count == 3) {
                          uVar1 = 0xff;
                        }
                        *local_78 = uVar1;
                        local_78 = local_78 + 4;
                      }
                    }
                    else {
                      for (len = 0; len < iVar6; len = len + 1) {
                        iVar4 = get8(s);
                        *local_78 = (uchar)iVar4;
                        local_78 = local_78 + 4;
                      }
                    }
                  }
                }
                else {
                  skip(s,uVar2 * iVar3 * 2);
                  for (count = 0; count < 4; count = count + 1) {
                    puStack_68 = p + count;
                    if (count < iVar3) {
                      w = 0;
                      while (w < iVar6) {
                        uVar7 = get8(s);
                        if (uVar7 != 0x80) {
                          if ((int)uVar7 < 0x80) {
                            h = uVar7 + 1;
                            w = h + w;
                            for (; h != 0; h = h + -1) {
                              iVar4 = get8(s);
                              *puStack_68 = (uchar)iVar4;
                              puStack_68 = puStack_68 + 4;
                            }
                          }
                          else if (0x80 < (int)uVar7) {
                            h = (uVar7 ^ 0xff) + 2;
                            iVar4 = get8(s);
                            w = h + w;
                            for (; h != 0; h = h + -1) {
                              *puStack_68 = (uchar)iVar4;
                              puStack_68 = puStack_68 + 4;
                            }
                          }
                        }
                      }
                    }
                    else {
                      for (len = 0; len < iVar6; len = len + 1) {
                        uVar1 = '\0';
                        if (count == 3) {
                          uVar1 = 0xff;
                        }
                        *puStack_68 = uVar1;
                        puStack_68 = puStack_68 + 4;
                      }
                    }
                  }
                }
                if (((req_comp == 0) || (req_comp == 4)) ||
                   (p = convert_format(p,4,req_comp,x_00,uVar2), s_local = (stbi *)p,
                   (stbi *)p != (stbi *)0x0)) {
                  if (comp != (int *)0x0) {
                    *comp = iVar3;
                  }
                  *y = uVar2;
                  *x = x_00;
                  s_local = (stbi *)p;
                }
              }
            }
            else {
              e("PSD has an unknown compression format");
              s_local = (stbi *)0x0;
            }
          }
          else {
            e("PSD is not in RGB color format");
            s_local = (stbi *)0x0;
          }
        }
        else {
          e("PSD bit depth is not 8 bit");
          s_local = (stbi *)0x0;
        }
      }
    }
    else {
      e("Unsupported version of PSD image");
      s_local = (stbi *)0x0;
    }
  }
  else {
    e("Corrupt PSD image");
    s_local = (stbi *)0x0;
  }
  return (stbi_uc *)s_local;
}

Assistant:

static stbi_uc *psd_load(stbi *s, int *x, int *y, int *comp, int req_comp)
{
	int	pixelCount;
	int channelCount, compression;
	int channel, i, count, len;
   int w,h;
   uint8 *out;

	// Check identifier
	if (get32(s) != 0x38425053)	// "8BPS"
		return epuc("not PSD", "Corrupt PSD image");

	// Check file type version.
	if (get16(s) != 1)
		return epuc("wrong version", "Unsupported version of PSD image");

	// Skip 6 reserved bytes.
	skip(s, 6 );

	// Read the number of channels (R, G, B, A, etc).
	channelCount = get16(s);
	if (channelCount < 0 || channelCount > 16)
		return epuc("wrong channel count", "Unsupported number of channels in PSD image");

	// Read the rows and columns of the image.
   h = get32(s);
   w = get32(s);

	// Make sure the depth is 8 bits.
	if (get16(s) != 8)
		return epuc("unsupported bit depth", "PSD bit depth is not 8 bit");

	// Make sure the color mode is RGB.
	// Valid options are:
	//   0: Bitmap
	//   1: Grayscale
	//   2: Indexed color
	//   3: RGB color
	//   4: CMYK color
	//   7: Multichannel
	//   8: Duotone
	//   9: Lab color
	if (get16(s) != 3)
		return epuc("wrong color format", "PSD is not in RGB color format");

	// Skip the Mode Data.  (It's the palette for indexed color; other info for other modes.)
	skip(s,get32(s) );

	// Skip the image resources.  (resolution, pen tool paths, etc)
	skip(s, get32(s) );

	// Skip the reserved data.
	skip(s, get32(s) );

	// Find out if the data is compressed.
	// Known values:
	//   0: no compression
	//   1: RLE compressed
	compression = get16(s);
	if (compression > 1)
		return epuc("bad compression", "PSD has an unknown compression format");

	// Create the destination image.
	out = (stbi_uc *) malloc(4 * w*h);
	if (!out) return epuc("outofmem", "Out of memory");
   pixelCount = w*h;

	// Initialize the data to zero.
	//memset( out, 0, pixelCount * 4 );

	// Finally, the image data.
	if (compression) {
		// RLE as used by .PSD and .TIFF
		// Loop until you get the number of unpacked bytes you are expecting:
		//     Read the next source byte into n.
		//     If n is between 0 and 127 inclusive, copy the next n+1 bytes literally.
		//     Else if n is between -127 and -1 inclusive, copy the next byte -n+1 times.
		//     Else if n is 128, noop.
		// Endloop

		// The RLE-compressed data is preceeded by a 2-byte data count for each row in the data,
		// which we're going to just skip.
		skip(s, h * channelCount * 2 );

		// Read the RLE data by channel.
		for (channel = 0; channel < 4; channel++) {
			uint8 *p;

         p = out+channel;
			if (channel >= channelCount) {
				// Fill this channel with default data.
				for (i = 0; i < pixelCount; i++) *p = (channel == 3 ? 255 : 0), p += 4;
			} else {
				// Read the RLE data.
				count = 0;
				while (count < pixelCount) {
					len = get8(s);
					if (len == 128) {
						// No-op.
					} else if (len < 128) {
						// Copy next len+1 bytes literally.
						len++;
						count += len;
						while (len) {
							*p = get8(s);
                     p += 4;
							len--;
						}
					} else if (len > 128) {
						uint32	val;
						// Next -len+1 bytes in the dest are replicated from next source byte.
						// (Interpret len as a negative 8-bit int.)
						len ^= 0x0FF;
						len += 2;
                  val = get8(s);
						count += len;
						while (len) {
							*p = val;
                     p += 4;
							len--;
						}
					}
				}
			}
		}

	} else {
		// We're at the raw image data.  It's each channel in order (Red, Green, Blue, Alpha, ...)
		// where each channel consists of an 8-bit value for each pixel in the image.

		// Read the data by channel.
		for (channel = 0; channel < 4; channel++) {
			uint8 *p;

         p = out + channel;
			if (channel > channelCount) {
				// Fill this channel with default data.
				for (i = 0; i < pixelCount; i++) *p = channel == 3 ? 255 : 0, p += 4;
			} else {
				// Read the data.
				count = 0;
				for (i = 0; i < pixelCount; i++)
					*p = get8(s), p += 4;
			}
		}
	}

	if (req_comp && req_comp != 4) {
		out = convert_format(out, 4, req_comp, w, h);
		if (out == NULL) return out; // convert_format frees input on failure
	}

	if (comp) *comp = channelCount;
	*y = h;
	*x = w;

	return out;
}